

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal.cpp
# Opt level: O2

string * duckdb::TemplatedDecimalToString<long>
                   (string *__return_storage_ptr__,long value,uint8_t width,uint8_t scale)

{
  uint uVar1;
  tuple<char_*,_std::default_delete<char[]>_> dst;
  unique_ptr<char[],_std::default_delete<char>,_false> data;
  __uniq_ptr_impl<char,_std::default_delete<char[]>_> local_38;
  
  uVar1 = DecimalToString::DecimalLength<long>(value,width,scale);
  dst.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
  super__Head_base<0UL,_char_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>)
       operator_new__((long)(int)(uVar1 + 1));
  local_38._M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
  super__Head_base<0UL,_char_*,_false>._M_head_impl =
       (tuple<char_*,_std::default_delete<char[]>_>)
       (tuple<char_*,_std::default_delete<char[]>_>)
       dst.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
       super__Head_base<0UL,_char_*,_false>._M_head_impl;
  DecimalToString::FormatDecimal<long>
            (value,width,scale,
             (char *)dst.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                     super__Head_base<0UL,_char_*,_false>._M_head_impl,(long)(int)uVar1);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             dst.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
             super__Head_base<0UL,_char_*,_false>._M_head_impl,
             (char *)((ulong)uVar1 +
                     (long)dst.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                           super__Head_base<0UL,_char_*,_false>._M_head_impl));
  ::std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

string TemplatedDecimalToString(SIGNED value, uint8_t width, uint8_t scale) {
	auto len = DecimalToString::DecimalLength<SIGNED>(value, width, scale);
	auto data = make_unsafe_uniq_array_uninitialized<char>(UnsafeNumericCast<size_t>(len + 1));
	DecimalToString::FormatDecimal<SIGNED>(value, width, scale, data.get(), UnsafeNumericCast<idx_t>(len));
	return string(data.get(), UnsafeNumericCast<uint32_t>(len));
}